

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

bool __thiscall
HVectorBase<HighsCDouble>::isEqual(HVectorBase<HighsCDouble> *this,HVectorBase<HighsCDouble> *v0)

{
  pointer pHVar1;
  bool bVar2;
  int *in_RSI;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_RDI;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_ffffffffffffffd8;
  bool local_1;
  
  if (*(int *)&(in_RDI->super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>)._M_impl.
               super__Vector_impl_data._M_start == *in_RSI) {
    if (*(int *)((long)&(in_RDI->super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>).
                        _M_impl.super__Vector_impl_data._M_start + 4) == in_RSI[1]) {
      bVar2 = std::operator!=((vector<int,_std::allocator<int>_> *)in_RDI,
                              (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffd8);
      if (bVar2) {
        local_1 = false;
      }
      else {
        bVar2 = std::operator!=(in_RDI,in_stack_ffffffffffffffd8);
        if (bVar2) {
          local_1 = false;
        }
        else {
          pHVar1 = in_RDI[2].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          if (((double)pHVar1 != *(double *)(in_RSI + 0xe)) ||
             (NAN((double)pHVar1) || NAN(*(double *)(in_RSI + 0xe)))) {
            local_1 = false;
          }
          else {
            local_1 = true;
          }
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HVectorBase<Real>::isEqual(const HVectorBase<Real>& v0) {
  if (this->size != v0.size) return false;
  if (this->count != v0.count) return false;
  if (this->index != v0.index) return false;
  if (this->array != v0.array) return false;
  //  if (this->index.size() != v0.index.size()) return false;
  //  for (HighsInt el = 0; el < (HighsInt)this->index.size(); el++)
  //    if (this->index[el] != v0.index[el]) return false;
  if (this->synthetic_tick != v0.synthetic_tick) return false;
  return true;
}